

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bm_utils.c
# Opt level: O0

long set_state(int table,long sf,long procs,long step,long *extra_rows)

{
  long in_RCX;
  long in_RDX;
  long lVar1;
  long in_RSI;
  int in_EDI;
  long *in_R8;
  long result;
  long remainder;
  long rowcount;
  int i;
  int local_34;
  long local_8;
  
  if ((in_RSI == 0) || (in_RCX == 0)) {
    local_8 = 0;
  }
  else {
    if (1000 < in_RSI / in_RDX) {
      fprintf(_stderr,"%s","SCALE OVERFLOW. RE-RUN WITH MORE CHILDREN.");
      abort();
    }
    lVar1 = (tdefs[in_EDI].base % in_RDX) * in_RSI;
    local_8 = lVar1 / in_RDX + in_RSI * (tdefs[in_EDI].base / in_RDX);
    for (local_34 = 0; (long)local_34 < in_RCX + -1; local_34 = local_34 + 1) {
      if (tdefs[in_EDI].gen_seed != (_func_long_varargs *)0x0) {
        if (in_EDI == 5) {
          (*tdefs[5].gen_seed)(1,local_8);
        }
        else if (tdefs[in_EDI].gen_seed != (_func_long_varargs *)0x0) {
          (*tdefs[in_EDI].gen_seed)(0,local_8);
        }
        if (tdefs[in_EDI].child != -1) {
          (*tdefs[tdefs[in_EDI].child].gen_seed)(0,local_8);
        }
      }
    }
    *in_R8 = lVar1 % in_RDX;
    if ((in_RDX < in_RCX) && (tdefs[in_EDI].gen_seed != (_func_long_varargs *)0x0)) {
      (*tdefs[in_EDI].gen_seed)(*in_R8);
    }
  }
  return local_8;
}

Assistant:

long
set_state(int table, long sf, long procs, long step, long *extra_rows)
{
    int i;
	long rowcount, remainder, result;
	
    if (sf == 0 || step == 0)
        {
        return(0);
        }

	rowcount = tdefs[table].base / procs;
	if ((sf / procs) > (int)MAX_32B_SCALE)
		INTERNAL_ERROR("SCALE OVERFLOW. RE-RUN WITH MORE CHILDREN.");
	rowcount *= sf;
	remainder = (tdefs[table].base % procs) * sf;
	rowcount += remainder / procs;
	result = rowcount;
	for (i=0; i < step - 1; i++)
		{
		if (tdefs[table].gen_seed == NULL)
			{
			/* must be a deterministic table, which doesn't need a random seed. */
			continue;
			}
		if (table == LINE)	/* special case for shared seeds */
			tdefs[table].gen_seed(1, rowcount);
		else if (tdefs[table].gen_seed != NULL)
			tdefs[table].gen_seed(0, rowcount);
		/* need to set seeds of child in case there's a dependency */
		/* NOTE: this assumes that the parent and child have the same base row count */
			if (tdefs[table].child != NONE) 
			tdefs[tdefs[table].child].gen_seed(0,rowcount);
		}
	*extra_rows = remainder % procs;
	if (step > procs)	/* moving to the end to generate updates */
		{
		if (tdefs[table].gen_seed != NULL)
			{
			tdefs[table].gen_seed(*extra_rows);
			}
		}

	return(result);
}